

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * fts5ExprPrintTcl(Fts5Config *pConfig,char *zNearsetCmd,Fts5ExprNode *pExpr)

{
  uint *puVar1;
  int *piVar2;
  long lVar3;
  char *pcVar4;
  Fts5ExprNode *extraout_RDX;
  Fts5ExprNode *pExpr_00;
  Fts5ExprNode *extraout_RDX_00;
  undefined8 *puVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  switch(*(undefined4 *)zNearsetCmd) {
  case 2:
    pcVar6 = "AND";
    break;
  case 3:
    pcVar6 = "NOT";
    break;
  case 4:
  case 9:
    puVar1 = *(uint **)(zNearsetCmd + 0x20);
    pcVar6 = fts5PrintfAppend((char *)0x0,"%s ",pConfig);
    if (pcVar6 == (char *)0x0) {
      return (char *)0x0;
    }
    piVar2 = *(int **)(puVar1 + 2);
    if (piVar2 != (int *)0x0) {
      if (*piVar2 == 1) {
        pcVar6 = fts5PrintfAppend(pcVar6,"-col %d ",(ulong)(uint)piVar2[1]);
      }
      else {
        pcVar6 = fts5PrintfAppend(pcVar6,"-col {%d",(ulong)(uint)piVar2[1]);
        if (1 < **(int **)(puVar1 + 2)) {
          lVar7 = 1;
          do {
            pcVar6 = fts5PrintfAppend(pcVar6," %d",(ulong)(uint)piVar2[lVar7 + 1]);
            lVar7 = lVar7 + 1;
          } while (lVar7 < **(int **)(puVar1 + 2));
        }
        pcVar6 = fts5PrintfAppend(pcVar6,"} ");
      }
      if (pcVar6 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if ((1 < (int)puVar1[4]) &&
       (pcVar6 = fts5PrintfAppend(pcVar6,"-near %d ",(ulong)*puVar1), pcVar6 == (char *)0x0)) {
      return (char *)0x0;
    }
    pcVar6 = fts5PrintfAppend(pcVar6,"--");
    if (pcVar6 == (char *)0x0) {
      return (char *)0x0;
    }
    if (0 < (int)puVar1[4]) {
      lVar7 = 0;
      do {
        lVar3 = *(long *)(puVar1 + lVar7 * 2 + 6);
        pcVar6 = fts5PrintfAppend(pcVar6," {");
        if (pcVar6 == (char *)0x0) {
          return (char *)0x0;
        }
        puVar5 = (undefined8 *)(lVar3 + 0x28);
        lVar8 = 0;
        while (lVar8 < *(int *)(lVar3 + 0x18)) {
          pcVar4 = " ";
          if (lVar8 == 0) {
            pcVar4 = "";
          }
          pcVar6 = fts5PrintfAppend(pcVar6,"%s%s",pcVar4,*puVar5);
          if (*(char *)(puVar5 + -1) != '\0') {
            pcVar6 = fts5PrintfAppend(pcVar6,"*");
          }
          lVar8 = lVar8 + 1;
          puVar5 = puVar5 + 4;
          if (pcVar6 == (char *)0x0) {
            return (char *)0x0;
          }
        }
        pcVar6 = fts5PrintfAppend(pcVar6,"}");
        if (pcVar6 == (char *)0x0) {
          return (char *)0x0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)puVar1[4]);
      return pcVar6;
    }
    return pcVar6;
  default:
    pcVar6 = "OR";
  }
  pcVar6 = sqlite3_mprintf("%s",pcVar6);
  if (pcVar6 != (char *)0x0) {
    lVar7 = 0;
    pExpr_00 = extraout_RDX;
    do {
      if (*(int *)(zNearsetCmd + 0x28) <= lVar7) {
        return pcVar6;
      }
      pcVar4 = fts5ExprPrintTcl(pConfig,*(char **)(zNearsetCmd + lVar7 * 8 + 0x30),pExpr_00);
      if (pcVar4 == (char *)0x0) {
        sqlite3_free(pcVar6);
        return (char *)0x0;
      }
      pcVar6 = fts5PrintfAppend(pcVar6," [%z]",pcVar4);
      lVar7 = lVar7 + 1;
      pExpr_00 = extraout_RDX_00;
    } while (pcVar6 != (char *)0x0);
  }
  return (char *)0x0;
}

Assistant:

static char *fts5ExprPrintTcl(
  Fts5Config *pConfig, 
  const char *zNearsetCmd,
  Fts5ExprNode *pExpr
){
  char *zRet = 0;
  if( pExpr->eType==FTS5_STRING || pExpr->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pExpr->pNear;
    int i; 
    int iTerm;

    zRet = fts5PrintfAppend(zRet, "%s ", zNearsetCmd);
    if( zRet==0 ) return 0;
    if( pNear->pColset ){
      int *aiCol = pNear->pColset->aiCol;
      int nCol = pNear->pColset->nCol;
      if( nCol==1 ){
        zRet = fts5PrintfAppend(zRet, "-col %d ", aiCol[0]);
      }else{
        zRet = fts5PrintfAppend(zRet, "-col {%d", aiCol[0]);
        for(i=1; i<pNear->pColset->nCol; i++){
          zRet = fts5PrintfAppend(zRet, " %d", aiCol[i]);
        }
        zRet = fts5PrintfAppend(zRet, "} ");
      }
      if( zRet==0 ) return 0;
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, "-near %d ", pNear->nNear);
      if( zRet==0 ) return 0;
    }

    zRet = fts5PrintfAppend(zRet, "--");
    if( zRet==0 ) return 0;

    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];

      zRet = fts5PrintfAppend(zRet, " {");
      for(iTerm=0; zRet && iTerm<pPhrase->nTerm; iTerm++){
        char *zTerm = pPhrase->aTerm[iTerm].zTerm;
        zRet = fts5PrintfAppend(zRet, "%s%s", iTerm==0?"":" ", zTerm);
        if( pPhrase->aTerm[iTerm].bPrefix ){
          zRet = fts5PrintfAppend(zRet, "*");
        }
      }

      if( zRet ) zRet = fts5PrintfAppend(zRet, "}");
      if( zRet==0 ) return 0;
    }

  }else{
    char const *zOp = 0;
    int i;
    switch( pExpr->eType ){
      case FTS5_AND: zOp = "AND"; break;
      case FTS5_NOT: zOp = "NOT"; break;
      default: 
        assert( pExpr->eType==FTS5_OR );
        zOp = "OR"; 
        break;
    }

    zRet = sqlite3_mprintf("%s", zOp);
    for(i=0; zRet && i<pExpr->nChild; i++){
      char *z = fts5ExprPrintTcl(pConfig, zNearsetCmd, pExpr->apChild[i]);
      if( !z ){
        sqlite3_free(zRet);
        zRet = 0;
      }else{
        zRet = fts5PrintfAppend(zRet, " [%z]", z);
      }
    }
  }

  return zRet;
}